

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

NondegeneracyCheckResult * __thiscall
slang::ast::SimpleAssertionExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,SimpleAssertionExpr *this)

{
  SyntaxNode *this_00;
  Expression *pEVar1;
  bool bVar2;
  SourceRange SVar3;
  NondegeneracyCheckResult NStack_38;
  
  (__return_storage_ptr__->status).m_bits = 0;
  (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
  (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
  __return_storage_ptr__->isAlwaysFalse = false;
  if (this->isNullExpr == true) {
    (__return_storage_ptr__->status).m_bits = 4;
    this_00 = (this->super_AssertionExpr).syntax;
    if (this_00 != (SyntaxNode *)0x0) {
      SVar3 = slang::syntax::SyntaxNode::sourceRange(this_00);
      __return_storage_ptr__->noMatchRange = SVar3;
      __return_storage_ptr__->isAlwaysFalse = true;
    }
  }
  if ((this->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged == true) {
    SequenceRepetition::checkNondegeneracy((SequenceRepetition *)&this->repetition);
    AssertionExpr::NondegeneracyCheckResult::operator|=(__return_storage_ptr__,&NStack_38);
  }
  pEVar1 = this->expr;
  if (pEVar1->kind == AssertionInstance) {
    bVar2 = Type::isSequenceType((pEVar1->type).ptr);
    if (bVar2) {
      AssertionExpr::checkNondegeneracy(&NStack_38,(AssertionExpr *)pEVar1[1].type.ptr);
      AssertionExpr::NondegeneracyCheckResult::operator|=(__return_storage_ptr__,&NStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SimpleAssertionExpr::checkNondegeneracyImpl() const {
    // If simple sequence expression can be evaluated to false
    // then it admits no possible match.
    NondegeneracyCheckResult result;
    if (isNullExpr) {
        result.status |= NondegeneracyStatus::AdmitsNoMatch;
        if (syntax) {
            result.noMatchRange = syntax->sourceRange();
            result.isAlwaysFalse = true;
        }
    }

    if (repetition)
        result |= repetition->checkNondegeneracy();

    if (expr.kind == ExpressionKind::AssertionInstance) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        if (aie.type->isSequenceType())
            result |= aie.body.checkNondegeneracy();
    }
    return result;
}